

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O1

wchar_t borg_attack_aux_launch(void)

{
  _Bool _Var1;
  ushort uVar2;
  int iVar3;
  borg_item_conflict *pbVar4;
  _Bool _Var5;
  wchar_t wVar6;
  char *what;
  wchar_t wVar7;
  long lVar8;
  wchar_t wVar9;
  ulong uVar10;
  wchar_t local_3c;
  int local_38;
  
  pbVar4 = borg_items;
  uVar2 = z_info->pack_size;
  wVar6 = L'\0';
  wVar7 = L'\0';
  if ((((borg_items[(ulong)uVar2 + 1].iqty != '\0') && (wVar7 = wVar6, borg.trait[0x70] == 0)) &&
      (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    if (uVar2 + 0xc < (uint)z_info->quiver_size + (uint)z_info->pack_size + 0xc) {
      uVar10 = (ulong)uVar2 + 0xc;
      lVar8 = (ulong)uVar2 * 0x388 + 0x2a60;
      local_38 = -1;
      wVar7 = L'\0';
      local_3c = L'\xffffffff';
      do {
        _Var1 = borg_items->curses[lVar8 + -0x26];
        if (((_Var1 != false) && (borg.trait[0x98] == (uint)borg_items->curses[lVar8 + -0x2a])) &&
           (iVar3 = *(int *)(borg_items->curses + lVar8 + -6), 0 < iVar3)) {
          wVar9 = borg.trait[0x94] * borg.trait[0x9a] *
                  ((int)pbVar4[(ulong)uVar2 + 1].to_d +
                   (int)*(short *)(borg_items->curses + lVar8 + -0x14) +
                  ((borg_items->curses[lVar8 + -0xd] + 1) * (uint)borg_items->curses[lVar8 + -0xe]
                  >> 1));
          _Var5 = borg_item_note_needs_id((borg_item_conflict *)(borg_items->desc + lVar8));
          wVar6 = wVar9 * 99;
          if (!_Var5) {
            wVar6 = wVar9;
          }
          if (L'\0' < wVar6) {
            wVar6 = borg_launch_bolt(L'\0',wVar6,L'\x01',borg.trait[0x9a] * 2 + L'\x06',
                                     (wchar_t)uVar10);
            if ((wVar6 != wVar7) || (iVar3 < local_38)) {
              if (wVar7 <= wVar6) {
                local_38 = iVar3;
                local_3c = (wchar_t)uVar10;
              }
              if (wVar7 < wVar6) {
                wVar7 = wVar6;
              }
            }
          }
        }
        if (_Var1 == false) break;
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0x388;
      } while (uVar10 < (ulong)z_info->quiver_size + (ulong)z_info->pack_size + 0xc);
    }
    else {
      wVar7 = L'\0';
      local_3c = L'\xffffffff';
    }
    if (borg_simulate == false) {
      what = format("# Firing missile \'%s\'",borg_items + local_3c);
      borg_note(what);
      borg_keypress(0x66);
      borg_keypress((local_3c - (uint)z_info->pack_size) + 0x24);
      borg_keypress(0x35);
      successful_target = L'\xfffffffe';
    }
  }
  return wVar7;
}

Assistant:

int borg_attack_aux_launch(void)
{
    int n, b_n = 0;

    int k, b_k = -1;
    int d = -1;
    int v, b_v = -1;

    borg_item *bow = &borg_items[INVEN_BOW];

    /* skip if we don't have a bow */
    if (bow->iqty == 0)
        return 0;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Scan the quiver */
    for (k = QUIVER_START; k < QUIVER_END; k++) {

        borg_item *item = &borg_items[k];

        /* Skip empty items */
        if (!item->iqty)
            break;

        /* Skip missiles that don't match the bow */
        if (item->tval != borg.trait[BI_AMMO_TVAL])
            continue;

        /* Skip worthless missiles */
        if (item->value <= 0)
            continue;

        /* Determine average damage */
        d = (item->dd * (item->ds + 1) / 2);
        d = d + item->to_d + bow->to_d;
        d = d * borg.trait[BI_AMMO_POWER] * borg.trait[BI_SHOTS];

        v = item->value;

        /* Boost the perceived damage on unID'd ones so he can get a quick
         * pseudoID on it */
        if (borg_item_note_needs_id(item))
            d = d * 99;

        /* Paranoia */
        if (d <= 0)
            continue;

        /* Choose optimal target of bolt */
        n = borg_launch_bolt(
            0, d, BORG_ATTACK_ARROW, 6 + 2 * borg.trait[BI_AMMO_POWER], k);

        /* if two attacks are equal, pick the cheaper ammo */
        if (n == b_n && v >= b_v)
            continue;

        if (n >= b_n) {
            b_n = n;
            b_v = v;
            b_k = k;
        }
    }

    /* Nothing to use */
    if (b_n < 0)
        return 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Do it */
    borg_note(format("# Firing missile '%s'", borg_items[b_k].desc));

    /* Fire */
    borg_keypress('f');

    /* Use the missile from the quiver */
    borg_keypress(((b_k - QUIVER_START) + '0'));

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -2;

    /* Value */
    return b_n;
}